

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O1

void finish(audit_regressor_data *dat)

{
  ostream *poVar1;
  vw_ostream *pvVar2;
  
  if (dat->values_audited < dat->loaded_regressor_values) {
    pvVar2 = &dat->all->trace_message;
    std::__ostream_insert<char,std::char_traits<char>>
              (&pvVar2->super_ostream,
               "Note: for some reason audit couldn\'t find all regressor values in dataset (",0x4b);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," of ",4);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," found).",8);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void finish(audit_regressor_data& dat)
{
  if (dat.values_audited < dat.loaded_regressor_values)
    dat.all->trace_message << "Note: for some reason audit couldn't find all regressor values in dataset ("
                           << dat.values_audited << " of " << dat.loaded_regressor_values << " found)." << endl;
}